

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O2

vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *
upb::generator::SortedExtensions
          (vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *__return_storage_ptr__,
          FileDefPtr file)

{
  int iVar1;
  int iVar2;
  upb_FieldDef *in_RAX;
  MessageDefPtr message;
  int i;
  FieldDefPtr local_28;
  
  (__return_storage_ptr__->super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.ptr_ = in_RAX;
  iVar1 = upb_FileDef_TopLevelExtensionCount(file.ptr_);
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::reserve
            (__return_storage_ptr__,(long)iVar1);
  iVar1 = 0;
  while( true ) {
    iVar2 = upb_FileDef_TopLevelExtensionCount(file.ptr_);
    if (iVar2 <= iVar1) break;
    local_28.ptr_ = upb_FileDef_TopLevelExtension(file.ptr_,iVar1);
    std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::emplace_back<upb::FieldDefPtr>
              (__return_storage_ptr__,&local_28);
    iVar1 = iVar1 + 1;
  }
  iVar1 = 0;
  while( true ) {
    iVar2 = upb_FileDef_TopLevelMessageCount(file.ptr_);
    if (iVar2 <= iVar1) break;
    message.ptr_ = upb_FileDef_TopLevelMessage(file.ptr_,iVar1);
    AddExtensionsFromMessage(message,__return_storage_ptr__);
    iVar1 = iVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<upb::FieldDefPtr> SortedExtensions(upb::FileDefPtr file) {
  std::vector<upb::FieldDefPtr> ret;
  ret.reserve(file.toplevel_extension_count());
  for (int i = 0; i < file.toplevel_extension_count(); i++) {
    ret.push_back(file.toplevel_extension(i));
  }
  for (int i = 0; i < file.toplevel_message_count(); i++) {
    AddExtensionsFromMessage(file.toplevel_message(i), &ret);
  }
  return ret;
}